

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * cargo_get_vfprint_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,__va_list_tag *ap)

{
  uint uVar1;
  cargo_highlight_t *highlights_in;
  char *pcVar2;
  ulong uVar3;
  char **ppcVar4;
  int *piVar5;
  undefined8 *puVar6;
  
  highlights_in = (cargo_highlight_t *)_cargo_calloc(highlight_count,0x10);
  if (highlights_in == (cargo_highlight_t *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (0 < (int)(uint)highlight_count) {
      uVar3 = (ulong)((uint)highlight_count & 0x7fffffff);
      ppcVar4 = &highlights_in->c;
      do {
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar5 = (int *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          piVar5 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar5 + 2;
        }
        ((cargo_highlight_t *)(ppcVar4 + -1))->i = *piVar5;
        uVar1 = ap->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar6 = (undefined8 *)((ulong)uVar1 + (long)ap->reg_save_area);
          ap->gp_offset = uVar1 + 8;
        }
        else {
          puVar6 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar6 + 1;
        }
        *ppcVar4 = (char *)*puVar6;
        ppcVar4 = ppcVar4 + 2;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    pcVar2 = cargo_get_fprintl_args(argc,argv,start,flags,max_width,highlight_count,highlights_in);
  }
  if (highlights_in != (cargo_highlight_t *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(highlights_in);
    }
    else {
      (*replaced_cargo_free)(highlights_in);
    }
  }
  return pcVar2;
}

Assistant:

char *cargo_get_vfprint_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count, va_list ap)
{
    char *ret = NULL;
    int i;
    cargo_highlight_t *highlights = NULL;

    // Create a list of indices to highlight from the va_args.
    if (!(highlights = _cargo_calloc(highlight_count, sizeof(cargo_highlight_t))))
    {
        CARGODBG(1, "Out of memory trying to allocate %lu highlights!\n",
                highlight_count);
        goto fail;
    }

    for (i = 0; i < (int)highlight_count; i++)
    {
        highlights[i].i = va_arg(ap, int);
        highlights[i].c = va_arg(ap, char *);
    }

    ret = cargo_get_fprintl_args(argc, argv, start, flags, max_width,
                                highlight_count, highlights);

fail:
    _cargo_xfree(&highlights);

    return ret;
}